

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_replace(HSQUIRRELVM v)

{
  SQFunctionProto *pSVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  EVP_PKEY_CTX *src;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  if (((pSVar2->super_SQObject)._flags & 1) == 0) {
    pSVar2 = SQVM::GetAt(v,v->_stackbase);
    pSVar1 = (pSVar2->super_SQObject)._unVal.pFunctionProto;
    pSVar2 = SQVM::GetAt(v,v->_stackbase + 1);
    sqvector<SQObjectPtr,_unsigned_int>::copy
              ((sqvector<SQObjectPtr,_unsigned_int> *)&pSVar1->_sourcename,
               (EVP_PKEY_CTX *)
               &(((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate,src);
    if ((pSVar1->_name).super_SQObject._type <= *(uint *)&(pSVar1->_name).super_SQObject._flags >> 2
       ) {
      sqvector<SQObjectPtr,_unsigned_int>::shrinktofit
                ((sqvector<SQObjectPtr,_unsigned_int> *)&pSVar1->_sourcename);
    }
    SQVM::Pop(v,1);
    return 1;
  }
  SVar3 = sq_throwerror(v,"Cannot modify immutable object");
  return SVar3;
}

Assistant:

static SQInteger array_replace(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *dst = _array(stack_get(v, 1));
    SQArray *src = _array(stack_get(v, 2));
    dst->_values.copy(src->_values);
    dst->ShrinkIfNeeded();
    VT_CLONE_FROM_TO(src, dst);
    v->Pop(1);
    return 1;
}